

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::call(Parser *this,ptr<Expression> *callee)

{
  vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Expression> pVar1;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_70;
  ExpressionList exprList;
  shared_ptr<Expression> local_48;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  consume((Parser *)callee);
  expressionList(&exprList,(Parser *)callee);
  consume((Parser *)callee,RightParen,"\')\'");
  std::
  make_shared<Call,std::shared_ptr<Expression>&,std::vector<std::shared_ptr<Expression>,std::allocator<std::shared_ptr<Expression>>>&>
            (&local_48,in_RDX);
  local_38._M_ptr = local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_refcount._M_pi =
       local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_70,&local_38);
  postfix(this,callee);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>::~vector
            (&exprList);
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::call(ptr<Expression> callee) {
    consume();
    ExpressionList exprList = expressionList();
    consume(TokenType::RightParen, "')'");

    ptr<Expression> expr = make<Call>(callee, exprList);
    return postfix(expr);
}